

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

StringRef getObjectFormatTypeName(ObjectFormatType Kind)

{
  StringRef SVar1;
  
  if (Kind < (Wasm|COFF)) {
    SVar1.Data = &DAT_0015a770 + *(int *)(&DAT_0015a770 + (ulong)Kind * 4);
    SVar1.Length = *(size_t *)(&DAT_0015a748 + (ulong)Kind * 8);
    return SVar1;
  }
  llvm::llvm_unreachable_internal
            ("unknown object format type",
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
             ,0x268);
}

Assistant:

static StringRef getObjectFormatTypeName(Triple::ObjectFormatType Kind) {
  switch (Kind) {
  case Triple::UnknownObjectFormat: return "";
  case Triple::COFF: return "coff";
  case Triple::ELF: return "elf";
  case Triple::MachO: return "macho";
  case Triple::Wasm: return "wasm";
  }
  llvm_unreachable("unknown object format type");
}